

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O2

void Hacl_Hash_MD5_reset(Hacl_Streaming_MD_state_32 *state)

{
  uint32_t *puVar1;
  
  puVar1 = state->block_state;
  puVar1[0] = 0x67452301;
  puVar1[1] = 0xefcdab89;
  puVar1[2] = 0x98badcfe;
  puVar1[3] = 0x10325476;
  state->total_len = 0;
  return;
}

Assistant:

void Hacl_Hash_MD5_reset(Hacl_Streaming_MD_state_32 *state)
{
  Hacl_Streaming_MD_state_32 scrut = *state;
  uint8_t *buf = scrut.buf;
  uint32_t *block_state = scrut.block_state;
  Hacl_Hash_MD5_init(block_state);
  Hacl_Streaming_MD_state_32
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U };
  state[0U] = tmp;
}